

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O1

void __thiscall QGraphicsGridLayout::setGeometry(QGraphicsGridLayout *this,QRectF *rect)

{
  QGraphicsGridLayoutPrivate *this_00;
  long in_FS_OFFSET;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  undefined1 local_48 [8];
  double dStack_40;
  double local_38;
  double dStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsGridLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  QGraphicsLayoutItem::setGeometry((QGraphicsLayoutItem *)this,rect);
  local_38 = -NAN;
  dStack_30 = -NAN;
  local_48 = (undefined1  [8])0xffffffffffffffff;
  dStack_40 = -NAN;
  QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)this);
  (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[3])(this);
  QGraphicsLayoutPrivate::visualDirection((QGraphicsLayoutPrivate *)this_00);
  QGridLayoutEngine::setVisualDirection((LayoutDirection)&this_00->engine);
  local_48 = (undefined1  [8])((double)local_48 + -NAN);
  dStack_40 = dStack_40 + -NAN;
  local_38 = local_38 + NAN;
  dStack_30 = dStack_30 + NAN;
  QGraphicsGridLayoutPrivate::styleInfo(this_00);
  QGridLayoutEngine::setGeometries((QRectF *)&this_00->engine,(QAbstractLayoutStyleInfo *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsGridLayout::setGeometry(const QRectF &rect)
{
    Q_D(QGraphicsGridLayout);
    QGraphicsLayout::setGeometry(rect);
    QRectF effectiveRect = geometry();
    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);
    Qt::LayoutDirection visualDir = d->visualDirection();
    d->engine.setVisualDirection(visualDir);
    if (visualDir == Qt::RightToLeft)
        qSwap(left, right);
    effectiveRect.adjust(+left, +top, -right, -bottom);
    d->engine.setGeometries(effectiveRect, d->styleInfo());
#ifdef QGRIDLAYOUTENGINE_DEBUG
    if (qt_graphicsLayoutDebug()) {
        static int counter = 0;
        qDebug("==== BEGIN DUMP OF QGraphicsGridLayout (%d)====", counter++);
        d->dump(1);
        qDebug("==== END DUMP OF QGraphicsGridLayout ====");
    }
#endif
}